

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

const_iterator __thiscall
QHash<QObject*,QString>::constFindImpl<QObject*>(QHash<QObject*,QString> *this,QObject **key)

{
  Data<QHashPrivate::Node<QObject*,QString>> *this_00;
  Data<QHashPrivate::Node<QObject_*,_QString>_> *pDVar1;
  ulong uVar2;
  Bucket BVar3;
  const_iterator cVar4;
  
  this_00 = *(Data<QHashPrivate::Node<QObject*,QString>> **)this;
  if ((this_00 != (Data<QHashPrivate::Node<QObject*,QString>> *)0x0) &&
     (*(long *)(this_00 + 8) != 0)) {
    BVar3 = QHashPrivate::Data<QHashPrivate::Node<QObject*,QString>>::findBucket<QObject*>
                      (this_00,key);
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) {
      pDVar1 = *(Data<QHashPrivate::Node<QObject_*,_QString>_> **)this;
      uVar2 = ((long)BVar3.span - (long)pDVar1->spans) / 0x90 << 7 | BVar3.index;
      goto LAB_0029abaa;
    }
  }
  uVar2 = 0;
  pDVar1 = (Data<QHashPrivate::Node<QObject_*,_QString>_> *)0x0;
LAB_0029abaa:
  cVar4.i.bucket = uVar2;
  cVar4.i.d = pDVar1;
  return (const_iterator)cVar4.i;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return end();
        return const_iterator({d, it.toBucketIndex(d)});
    }